

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
sendHttpRequestCRUD(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
                   IOTHUB_REQUEST_MODE iotHubRequestMode,char *deviceName,char *moduleId,
                   BUFFER_HANDLE deviceJsonBuffer,size_t numberOfDevices,
                   BUFFER_HANDLE responseBuffer)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  HTTPAPIEX_RESULT HVar2;
  STRING_HANDLE uriResource_00;
  LOGGER_LOG p_Var3;
  uint *statusCode_00;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  char local_1a8 [3];
  uchar is_error;
  uint statusCode;
  char relativePath [256];
  HTTPAPI_REQUEST_TYPE httpApiRequestType;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  HTTP_HEADERS_HANDLE httpHeader;
  HTTPAPIEX_HANDLE httpExApiHandle;
  HTTPAPIEX_SAS_HANDLE httpExApiSasHandle;
  STRING_HANDLE keyName;
  STRING_HANDLE accessKey;
  STRING_HANDLE uriResource;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  size_t numberOfDevices_local;
  BUFFER_HANDLE deviceJsonBuffer_local;
  char *moduleId_local;
  char *deviceName_local;
  IOTHUB_REQUEST_MODE iotHubRequestMode_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  undefined4 uVar4;
  
  keyName = (STRING_HANDLE)0x0;
  httpExApiSasHandle = (HTTPAPIEX_SAS_HANDLE)0x0;
  httpExApiHandle = (HTTPAPIEX_HANDLE)0x0;
  httpHeader = (HTTP_HEADERS_HANDLE)0x0;
  l = (LOGGER_LOG)0x0;
  uriResource_00 = createUriPath(registryManagerHandle);
  if (uriResource_00 == (STRING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"sendHttpRequestCRUD",0x48a,1,"STRING_construct failed for uriResource");
    }
    uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
  }
  else {
    keyName = STRING_construct(registryManagerHandle->sharedAccessKey);
    if (keyName == (STRING_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"sendHttpRequestCRUD",0x48f,1,"STRING_construct failed for accessKey");
      }
      uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else if ((registryManagerHandle->keyName == (char *)0x0) ||
            (httpExApiSasHandle =
                  (HTTPAPIEX_SAS_HANDLE)STRING_construct(registryManagerHandle->keyName),
            httpExApiSasHandle != (HTTPAPIEX_SAS_HANDLE)0x0)) {
      l = (LOGGER_LOG)createHttpHeader(iotHubRequestMode);
      if ((HTTP_HEADERS_HANDLE)l == (HTTP_HEADERS_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"sendHttpRequestCRUD",0x499,1,"HttpHeader creation failed");
        }
        uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
      }
      else {
        httpExApiHandle =
             (HTTPAPIEX_HANDLE)
             HTTPAPIEX_SAS_Create(keyName,uriResource_00,(STRING_HANDLE)httpExApiSasHandle);
        if (httpExApiHandle == (HTTPAPIEX_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"sendHttpRequestCRUD",0x49e,1,"HTTPAPIEX_SAS_Create failed");
          }
          uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
        }
        else {
          httpHeader = (HTTP_HEADERS_HANDLE)HTTPAPIEX_Create(registryManagerHandle->hostname);
          if ((HTTPAPIEX_HANDLE)httpHeader == (HTTPAPIEX_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                        ,"sendHttpRequestCRUD",0x4a3,1,"HTTPAPIEX_Create failed");
            }
            uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
          }
          else {
            l_6._3_1_ = '\0';
            if ((iotHubRequestMode == IOTHUB_REQUEST_CREATE) ||
               (iotHubRequestMode == IOTHUB_REQUEST_UPDATE)) {
              relativePath[0xfc] = '\x03';
              relativePath[0xfd] = '\0';
              relativePath[0xfe] = '\0';
              relativePath[0xff] = '\0';
            }
            else if (iotHubRequestMode == IOTHUB_REQUEST_DELETE) {
              relativePath[0xfc] = '\x04';
              relativePath[0xfd] = '\0';
              relativePath[0xfe] = '\0';
              relativePath[0xff] = '\0';
            }
            else {
              if (((iotHubRequestMode != IOTHUB_REQUEST_GET) &&
                  (iotHubRequestMode != IOTHUB_REQUEST_GET_DEVICE_LIST)) &&
                 (iotHubRequestMode != IOTHUB_REQUEST_GET_STATISTICS)) {
                l_6._3_1_ = '\x01';
              }
              relativePath[0xfc] = '\x01';
              relativePath[0xfd] = '\0';
              relativePath[0xfe] = '\0';
              relativePath[0xff] = '\0';
            }
            if (l_6._3_1_ == '\0') {
              IVar1 = createRelativePath(iotHubRequestMode,deviceName,moduleId,numberOfDevices,
                                         local_1a8);
              if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
                statusCode_00 = (uint *)((long)&l_6 + 4);
                HVar2 = HTTPAPIEX_SAS_ExecuteRequest
                                  ((HTTPAPIEX_SAS_HANDLE)httpExApiHandle,
                                   (HTTPAPIEX_HANDLE)httpHeader,relativePath._252_4_,local_1a8,
                                   (HTTP_HEADERS_HANDLE)l,deviceJsonBuffer,statusCode_00,
                                   (HTTP_HEADERS_HANDLE)0x0,responseBuffer);
                uVar4 = (undefined4)((ulong)statusCode_00 >> 0x20);
                if (HVar2 == HTTPAPIEX_OK) {
                  if (l_6._4_4_ < 0x12d) {
                    uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_OK;
                  }
                  else if ((iotHubRequestMode == IOTHUB_REQUEST_CREATE) && (l_6._4_4_ == 0x199)) {
                    uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_DEVICE_EXIST;
                  }
                  else if ((iotHubRequestMode == IOTHUB_REQUEST_GET) && (l_6._4_4_ == 0x194)) {
                    uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_DEVICE_NOT_EXIST;
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                ,"sendHttpRequestCRUD",0x4dd,1,"Http Failure status code %d.",
                                CONCAT44(uVar4,l_6._4_4_));
                    }
                    uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_HTTP_STATUS_ERROR;
                  }
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                              ,"sendHttpRequestCRUD",0x4cc,1,
                              "HTTPAPIEX_SAS_ExecuteRequest failed. Host:%s",
                              registryManagerHandle->hostname);
                  }
                  uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
                }
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"sendHttpRequestCRUD",0x4c7,1,"Failure creating relative path");
                }
                uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
              }
            }
            else {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                          ,"sendHttpRequestCRUD",0x4c0,1,"Invalid request type");
              }
              uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
            }
          }
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"sendHttpRequestCRUD",0x494,1,"STRING_construct failed for keyName");
      }
      uriResource._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
    }
  }
  HTTPHeaders_Free((HTTP_HEADERS_HANDLE)l);
  HTTPAPIEX_Destroy((HTTPAPIEX_HANDLE)httpHeader);
  HTTPAPIEX_SAS_Destroy((HTTPAPIEX_SAS_HANDLE)httpExApiHandle);
  STRING_delete((STRING_HANDLE)httpExApiSasHandle);
  STRING_delete(keyName);
  STRING_delete(uriResource_00);
  return uriResource._4_4_;
}

Assistant:

static IOTHUB_REGISTRYMANAGER_RESULT sendHttpRequestCRUD(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REQUEST_MODE iotHubRequestMode, const char* deviceName, const char* moduleId, BUFFER_HANDLE deviceJsonBuffer, size_t numberOfDevices, BUFFER_HANDLE responseBuffer)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    STRING_HANDLE uriResource = NULL;
    STRING_HANDLE accessKey = NULL;
    STRING_HANDLE keyName = NULL;
    HTTPAPIEX_SAS_HANDLE httpExApiSasHandle = NULL;
    HTTPAPIEX_HANDLE httpExApiHandle = NULL;
    HTTP_HEADERS_HANDLE httpHeader = NULL;

    if ((uriResource = createUriPath(registryManagerHandle)) == NULL)
    {
        LogError("STRING_construct failed for uriResource");
        result = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else if ((accessKey = STRING_construct(registryManagerHandle->sharedAccessKey)) == NULL)
    {
        LogError("STRING_construct failed for accessKey");
        result = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else if ((registryManagerHandle->keyName != NULL) && ((keyName = STRING_construct(registryManagerHandle->keyName)) == NULL))
    {
        LogError("STRING_construct failed for keyName");
        result = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else if ((httpHeader = createHttpHeader(iotHubRequestMode)) == NULL)
    {
        LogError("HttpHeader creation failed");
        result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
    }
    else if ((httpExApiSasHandle = HTTPAPIEX_SAS_Create(accessKey, uriResource, keyName)) == NULL)
    {
        LogError("HTTPAPIEX_SAS_Create failed");
        result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
    }
    else if ((httpExApiHandle = HTTPAPIEX_Create(registryManagerHandle->hostname)) == NULL)
    {
        LogError("HTTPAPIEX_Create failed");
        result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
    }
    else
    {
        HTTPAPI_REQUEST_TYPE httpApiRequestType = HTTPAPI_REQUEST_GET;
        char relativePath[256];
        unsigned int statusCode;
        unsigned char is_error = 0;

        if ((iotHubRequestMode == IOTHUB_REQUEST_CREATE) || (iotHubRequestMode == IOTHUB_REQUEST_UPDATE))
        {
            httpApiRequestType = HTTPAPI_REQUEST_PUT;
        }
        else if (iotHubRequestMode == IOTHUB_REQUEST_DELETE)
        {
            httpApiRequestType = HTTPAPI_REQUEST_DELETE;
        }
        else if ((iotHubRequestMode == IOTHUB_REQUEST_GET) || (iotHubRequestMode == IOTHUB_REQUEST_GET_DEVICE_LIST) || (iotHubRequestMode == IOTHUB_REQUEST_GET_STATISTICS))
        {
            httpApiRequestType = HTTPAPI_REQUEST_GET;
        }
        else
        {
            is_error = 1;
        }

        if (is_error)
        {
            LogError("Invalid request type");
            result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
        }
        else
        {
            if (createRelativePath(iotHubRequestMode, deviceName, moduleId, numberOfDevices, relativePath) != IOTHUB_REGISTRYMANAGER_OK)
            {
                LogError("Failure creating relative path");
                result = IOTHUB_REGISTRYMANAGER_ERROR;
            }
            else if (HTTPAPIEX_SAS_ExecuteRequest(httpExApiSasHandle, httpExApiHandle, httpApiRequestType, relativePath, httpHeader, deviceJsonBuffer, &statusCode, NULL, responseBuffer) != HTTPAPIEX_OK)
            {
                LogError("HTTPAPIEX_SAS_ExecuteRequest failed. Host:%s", registryManagerHandle->hostname);
                result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
            }
            else
            {
                if (statusCode > 300)
                {
                    if ((iotHubRequestMode == IOTHUB_REQUEST_CREATE) && (statusCode == 409))
                    {
                        result = IOTHUB_REGISTRYMANAGER_DEVICE_EXIST;
                    }
                    else if ((iotHubRequestMode == IOTHUB_REQUEST_GET) && (statusCode == 404))
                    {
                        result = IOTHUB_REGISTRYMANAGER_DEVICE_NOT_EXIST;
                    }
                    else
                    {
                        LogError("Http Failure status code %d.", statusCode);
                        result = IOTHUB_REGISTRYMANAGER_HTTP_STATUS_ERROR;
                    }
                }
                else
                {
                    result = IOTHUB_REGISTRYMANAGER_OK;
                }
            }
        }
    }

    HTTPHeaders_Free(httpHeader);
    HTTPAPIEX_Destroy(httpExApiHandle);
    HTTPAPIEX_SAS_Destroy(httpExApiSasHandle);
    STRING_delete(keyName);
    STRING_delete(accessKey);
    STRING_delete(uriResource);
    return result;
}